

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass_register.cpp
# Opt level: O1

void __thiscall
HawkTracer::parser::KlassRegister::_add_klass_field
          (KlassRegister *this,HT_EventKlassId klass_id,
          unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
          *field)

{
  EventKlass *this_00;
  int iVar1;
  mapped_type *pmVar2;
  _Head_base<0UL,_HawkTracer::parser::EventKlassField_*,_false> local_20;
  HT_EventKlassId local_14;
  
  local_14 = klass_id;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    pmVar2 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<HawkTracer::parser::EventKlass>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->_register,&local_14);
    this_00 = (pmVar2->
              super___shared_ptr<HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    local_20._M_head_impl =
         (field->_M_t).
         super___uniq_ptr_impl<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
         ._M_t.
         super__Tuple_impl<0UL,_HawkTracer::parser::EventKlassField_*,_std::default_delete<HawkTracer::parser::EventKlassField>_>
         .super__Head_base<0UL,_HawkTracer::parser::EventKlassField_*,_false>._M_head_impl;
    (field->_M_t).
    super___uniq_ptr_impl<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
    ._M_t.
    super__Tuple_impl<0UL,_HawkTracer::parser::EventKlassField_*,_std::default_delete<HawkTracer::parser::EventKlassField>_>
    .super__Head_base<0UL,_HawkTracer::parser::EventKlassField_*,_false>._M_head_impl =
         (EventKlassField *)0x0;
    EventKlass::add_field
              (this_00,(unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
                        *)&local_20);
    if (local_20._M_head_impl != (EventKlassField *)0x0) {
      std::default_delete<HawkTracer::parser::EventKlassField>::operator()
                ((default_delete<HawkTracer::parser::EventKlassField> *)&local_20,
                 local_20._M_head_impl);
    }
    local_20._M_head_impl = (EventKlassField *)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void KlassRegister::_add_klass_field(HT_EventKlassId klass_id, std::unique_ptr<EventKlassField> field)
{
    lock_guard l(_register_mtx);
    _register.at(klass_id)->add_field(std::move(field));
}